

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

int __thiscall
H264StreamReader::deserializeSliceHeader
          (H264StreamReader *this,SliceUnit *slice,uint8_t *buff,uint8_t *sliceEnd)

{
  int iVar1;
  int iVar2;
  uchar *dstBuffer;
  size_type sVar3;
  bool local_61;
  int local_54;
  int decodedLen;
  int tmpBufferSize;
  uint8_t *tmpBuffer;
  int maxHeaderSize;
  int toDecode;
  int nalRez;
  uint8_t *sliceEnd_local;
  uint8_t *buff_local;
  SliceUnit *slice_local;
  H264StreamReader *this_local;
  
  iVar1 = (int)sliceEnd - (int)buff;
  do {
    dstBuffer = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          (&this->m_decodedSliceHeader);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&this->m_decodedSliceHeader);
    iVar2 = (int)sVar3;
    local_54 = iVar1;
    if (iVar2 + -8 <= iVar1) {
      local_54 = iVar2 + -8;
    }
    iVar2 = NALUnit::decodeNAL(buff,buff + local_54,dstBuffer,(long)iVar2);
    iVar2 = SliceUnit::deserialize
                      (slice,dstBuffer,dstBuffer + iVar2,&this->m_spsMap,&this->m_ppsMap);
    if ((iVar2 == -10) && (local_54 < iVar1)) {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_decodedSliceHeader);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->m_decodedSliceHeader,sVar3 + 1);
    }
    local_61 = iVar2 == -10 && local_54 < iVar1;
  } while (local_61);
  return iVar2;
}

Assistant:

int H264StreamReader::deserializeSliceHeader(SliceUnit &slice, const uint8_t *buff, const uint8_t *sliceEnd)
{
    int nalRez, toDecode;
    const int maxHeaderSize = static_cast<int>(sliceEnd - buff);
    do
    {
        uint8_t *tmpBuffer = m_decodedSliceHeader.data();
        const int tmpBufferSize = static_cast<int>(m_decodedSliceHeader.size());
        toDecode = FFMIN(tmpBufferSize - 8, maxHeaderSize);
        const int decodedLen = SliceUnit::decodeNAL(buff, buff + toDecode, tmpBuffer, tmpBufferSize);
        nalRez = slice.deserialize(tmpBuffer, tmpBuffer + decodedLen, m_spsMap, m_ppsMap);
        if (nalRez == NOT_ENOUGH_BUFFER && toDecode < maxHeaderSize)
            m_decodedSliceHeader.resize(m_decodedSliceHeader.size() + 1);
    } while (nalRez == NOT_ENOUGH_BUFFER && toDecode < maxHeaderSize);

    return nalRez;
}